

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O3

Id __thiscall
spv::Builder::makeCompositeConstant
          (Builder *this,Id typeId,vector<unsigned_int,_std::allocator<unsigned_int>_> *members,
          bool specConstant)

{
  Op typeClass;
  pointer __s2;
  pointer puVar1;
  iterator __position;
  int iVar2;
  Id IVar3;
  Instruction *this_00;
  vector<spv::Instruction*,std::allocator<spv::Instruction*>> *this_01;
  size_t __n;
  long lVar4;
  size_t numMembers;
  Op opcode;
  size_type __n_00;
  size_t sVar5;
  Instruction *c;
  Instruction *local_50;
  Id local_44;
  ulong local_40;
  _Head_base<0UL,_spv::Instruction_*,_false> local_38;
  
  local_44 = typeId;
  if (typeId == 0) {
    __assert_fail("typeId",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                  ,0x765,"Id spv::Builder::makeCompositeConstant(Id, const std::vector<Id> &, bool)"
                 );
  }
  typeClass = (this->module).idToInstruction.
              super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
              super__Vector_impl_data._M_start[typeId]->opCode;
  __s2 = (members->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
         super__Vector_impl_data._M_start;
  puVar1 = (members->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  lVar4 = (long)puVar1 - (long)__s2;
  if (((typeClass == OpTypeCooperativeVectorNV | this->useReplicatedComposites) & lVar4 != 0) == 1)
  {
    __n = (long)puVar1 - (long)(__s2 + 1);
    if ((__n != 0) && (iVar2 = bcmp(__s2 + 1,__s2,__n), iVar2 != 0)) goto LAB_003d3c9a;
    local_50 = (Instruction *)CONCAT44(local_50._4_4_,0x1788);
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                *)&this->capabilities,(Capability *)&local_50);
    addExtension(this,"SPV_EXT_replicated_composites");
    numMembers = 1;
    opcode = specConstant + OpConstantCompositeReplicateEXT;
  }
  else {
LAB_003d3c9a:
    numMembers = lVar4 >> 2;
    opcode = OpConstantComposite;
    if (specConstant) {
      opcode = OpSpecConstantComposite;
    }
  }
  if ((int)typeClass < 0x1168) {
    if ((typeClass - OpTypeVector < 2) || (typeClass == OpTypeArray)) goto LAB_003d3d42;
    if (typeClass != OpTypeStruct) goto LAB_003d3ecd;
    if (specConstant) goto LAB_003d3d64;
    IVar3 = findStructConstant(this,typeId,members);
  }
  else {
    if (((typeClass != OpTypeCooperativeMatrixKHR) && (typeClass != OpTypeCooperativeMatrixNV)) &&
       (typeClass != OpTypeCooperativeVectorNV)) {
LAB_003d3ecd:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                    ,0x78f,
                    "Id spv::Builder::makeCompositeConstant(Id, const std::vector<Id> &, bool)");
    }
LAB_003d3d42:
    if (specConstant) goto LAB_003d3d64;
    IVar3 = findCompositeConstant(this,typeClass,opcode,typeId,members,numMembers);
  }
  if (IVar3 != 0) {
    return IVar3;
  }
LAB_003d3d64:
  local_40 = (ulong)typeClass;
  this_00 = (Instruction *)operator_new(0x60);
  IVar3 = this->uniqueId + 1;
  this->uniqueId = IVar3;
  this_00->_vptr_Instruction = (_func_int **)&PTR__Instruction_00927e68;
  this_00->resultId = IVar3;
  this_00->typeId = typeId;
  this_00->opCode = opcode;
  (this_00->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this_00->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  (this_00->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this_00->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this_00->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_offset = 0;
  (this_00->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  this_00->block = (Block *)0x0;
  __n_00 = (long)(members->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(members->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 2;
  local_50 = this_00;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(&this_00->operands,__n_00);
  std::vector<bool,_std::allocator<bool>_>::reserve(&this_00->idOperand,__n_00);
  if (numMembers != 0) {
    sVar5 = 0;
    do {
      Instruction::addIdOperand
                (this_00,(members->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                         _M_impl.super__Vector_impl_data._M_start[sVar5]);
      sVar5 = sVar5 + 1;
    } while (numMembers != sVar5);
  }
  local_38._M_head_impl = this_00;
  std::
  vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
  ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
            ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
              *)&this->constantsTypesGlobals,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_38);
  if (local_38._M_head_impl != (Instruction *)0x0) {
    (*(local_38._M_head_impl)->_vptr_Instruction[1])();
  }
  if ((int)local_40 == 0x1e) {
    this_01 = (vector<spv::Instruction*,std::allocator<spv::Instruction*>> *)
              std::__detail::
              _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->groupedStructConstants,&local_44);
  }
  else {
    local_38._M_head_impl._0_4_ = (int)local_40;
    this_01 = (vector<spv::Instruction*,std::allocator<spv::Instruction*>> *)
              std::__detail::
              _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->groupedConstants,(key_type *)&local_38);
  }
  __position._M_current = *(Instruction ***)(this_01 + 8);
  if (__position._M_current == *(Instruction ***)(this_01 + 0x10)) {
    std::vector<spv::Instruction*,std::allocator<spv::Instruction*>>::
    _M_realloc_insert<spv::Instruction*const&>(this_01,__position,&local_50);
  }
  else {
    *__position._M_current = local_50;
    *(long *)(this_01 + 8) = *(long *)(this_01 + 8) + 8;
  }
  Module::mapInstruction(&this->module,local_50);
  return local_50->resultId;
}

Assistant:

Id Builder::makeCompositeConstant(Id typeId, const std::vector<Id>& members, bool specConstant)
{
    assert(typeId);
    Op typeClass = getTypeClass(typeId);

    bool replicate = false;
    size_t numMembers = members.size();
    if (useReplicatedComposites || typeClass == OpTypeCooperativeVectorNV) {
        // use replicate if all members are the same
        replicate = numMembers > 0 &&
            std::equal(members.begin() + 1, members.end(), members.begin());

        if (replicate) {
            numMembers = 1;
            addCapability(spv::CapabilityReplicatedCompositesEXT);
            addExtension(spv::E_SPV_EXT_replicated_composites);
        }
    }

    Op opcode = replicate ?
        (specConstant ? OpSpecConstantCompositeReplicateEXT : OpConstantCompositeReplicateEXT) :
        (specConstant ? OpSpecConstantComposite : OpConstantComposite);

    switch (typeClass) {
    case OpTypeVector:
    case OpTypeArray:
    case OpTypeMatrix:
    case OpTypeCooperativeMatrixKHR:
    case OpTypeCooperativeMatrixNV:
    case OpTypeCooperativeVectorNV:
        if (! specConstant) {
            Id existing = findCompositeConstant(typeClass, opcode, typeId, members, numMembers);
            if (existing)
                return existing;
        }
        break;
    case OpTypeStruct:
        if (! specConstant) {
            Id existing = findStructConstant(typeId, members);
            if (existing)
                return existing;
        }
        break;
    default:
        assert(0);
        return makeFloatConstant(0.0);
    }

    Instruction* c = new Instruction(getUniqueId(), typeId, opcode);
    c->reserveOperands(members.size());
    for (size_t op = 0; op < numMembers; ++op)
        c->addIdOperand(members[op]);
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(c));
    if (typeClass == OpTypeStruct)
        groupedStructConstants[typeId].push_back(c);
    else
        groupedConstants[typeClass].push_back(c);
    module.mapInstruction(c);

    return c->getResultId();
}